

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scd_pcm.c
# Opt level: O1

void SCD_PCM_Write_Reg(void *info,UINT8 Reg,UINT8 Data)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  long lVar4;
  ushort uVar5;
  uint uVar6;
  undefined7 in_register_00000031;
  pcm_chip_ *chip;
  
  if (8 < (uint)CONCAT71(in_register_00000031,Reg)) {
    return;
  }
  bVar1 = *(byte *)((long)info + 0xe);
  pbVar3 = (byte *)((long)info + (ulong)bVar1 * 0x1c + 0x14);
  switch(CONCAT71(in_register_00000031,Reg) & 0xffffffff) {
  case 0:
    *pbVar3 = Data;
    bVar2 = *(byte *)((long)info + (ulong)bVar1 * 0x1c + 0x15);
    *(short *)((long)info + (ulong)bVar1 * 0x1c + 0x16) = (short)((bVar2 & 0xf) * (uint)Data >> 5);
    *(short *)((long)info + (ulong)bVar1 * 0x1c + 0x18) =
         (short)((uint)(bVar2 >> 4) * (uint)Data >> 5);
    return;
  case 1:
    *(UINT8 *)((long)info + (ulong)bVar1 * 0x1c + 0x15) = Data;
    uVar6 = (uint)*pbVar3;
    *(short *)((long)info + (ulong)bVar1 * 0x1c + 0x16) = (short)((Data & 0xf) * uVar6 >> 5);
    *(short *)((long)info + (ulong)bVar1 * 0x1c + 0x18) = (short)((Data >> 4) * uVar6 >> 5);
    return;
  case 2:
    uVar5 = CONCAT11(*(undefined1 *)((long)info + (ulong)bVar1 * 0x1c + 0x29),Data);
    break;
  case 3:
    uVar5 = CONCAT11(Data,*(undefined1 *)((long)info + (ulong)bVar1 * 0x1c + 0x28));
    break;
  case 4:
    *(UINT8 *)((long)info + (ulong)bVar1 * 0x1c + 0x1c) = Data;
    return;
  case 5:
    *(UINT8 *)((long)info + (ulong)bVar1 * 0x1c + 0x1d) = Data;
    return;
  case 6:
    *(ushort *)((long)info + (ulong)bVar1 * 0x1c + 0x1a) = (ushort)Data << 8;
    return;
  case 7:
    if ((Data & 0x40) == 0) {
      *(ushort *)((long)info + 0x10) = (ushort)Data << 0xc;
    }
    else {
      *(byte *)((long)info + 0xe) = Data & 7;
    }
    if ((char)Data < '\0') {
      *(undefined1 *)((long)info + 0xd) = 0xff;
      return;
    }
    *(undefined1 *)((long)info + 0xd) = 0;
    return;
  case 8:
    lVar4 = 0;
    do {
      if (*(char *)((long)info + lVar4 + 0x2a) == '\0') {
        *(uint *)((long)info + lVar4 + 0x20) = (uint)*(ushort *)((long)info + lVar4 + 0x1a) << 0xb;
      }
      lVar4 = lVar4 + 0x1c;
    } while (lVar4 != 0xe0);
    pbVar3 = (byte *)((long)info + 0x2a);
    lVar4 = 0;
    do {
      *pbVar3 = (byte)(1 << ((byte)lVar4 & 0x1f)) & ~Data;
      lVar4 = lVar4 + 1;
      pbVar3 = pbVar3 + 0x1c;
    } while (lVar4 != 8);
    return;
  }
  *(ushort *)((long)info + (ulong)bVar1 * 0x1c + 0x28) = uVar5;
  *(int *)((long)info + (ulong)bVar1 * 0x1c + 0x24) =
       (int)(long)((float)uVar5 * *(float *)((long)info + 8));
  return;
}

Assistant:

static void SCD_PCM_Write_Reg(void* info, UINT8 Reg, UINT8 Data)
{
	struct pcm_chip_ *chip = (struct pcm_chip_ *)info;
	int i;
	struct pcm_chan_* chan = &chip->Channel[chip->Cur_Chan];
	
	switch (Reg)
	{
		case 0x00:
			/* evelope register */
			chan->ENV = Data;
			chan->MUL_L = (Data * (chan->PAN & 0x0F)) >> 5;
			chan->MUL_R = (Data * (chan->PAN >> 4)) >> 5;
		break;
		
		case 0x01:
			/* pan register */
			chan->PAN = Data;
			chan->MUL_L = ((Data & 0x0F) * chan->ENV) >> 5;
			chan->MUL_R = ((Data >> 4) * chan->ENV) >> 5;
			break;
		
		case 0x02:
			/* frequency step (LB) registers */
			chan->Step_B &= 0xFF00;
			chan->Step_B |= Data;
			chan->Step = (UINT32)((float)chan->Step_B * chip->Rate);
			
			//LOG_MSG(pcm, LOG_MSG_LEVEL_DEBUG1,
			//	"Step low = %.2X   Step calculated = %.8X",
			//	Data, chan->Step);
			break;
		
		case 0x03:
			/* frequency step (HB) registers */
			chan->Step_B &= 0x00FF;
			chan->Step_B |= Data << 8;
			chan->Step = (UINT32)((float)chan->Step_B * chip->Rate);
			
			//LOG_MSG(pcm, LOG_MSG_LEVEL_DEBUG1,
			//	"Step high = %.2X   Step calculated = %.8X",
			//	Data, chan->Step);
			break;
		
		case 0x04:
			chan->Loop_Addr &= 0xFF00;
			chan->Loop_Addr |= Data;
			
			//LOG_MSG(pcm, LOG_MSG_LEVEL_DEBUG1,
			//	"Loop low = %.2X   Loop = %.8X",
			//	Data, chan->Loop_Addr);
			break;
		
		case 0x05:
			/* loop address registers */
			chan->Loop_Addr &= 0x00FF;
			chan->Loop_Addr |= Data << 8;
			
			//LOG_MSG(pcm, LOG_MSG_LEVEL_DEBUG1,
			//	"Loop high = %.2X   Loop = %.8X",
			//	Data, chan->Loop_Addr);
			break;
		
		case 0x06:
			/* start address registers */
			chan->St_Addr = Data << 8;
			
			//LOG_MSG(pcm, LOG_MSG_LEVEL_DEBUG1,
			//	"Start addr = %.2X   New Addr = %.8X",
			//	Data, chan->Addr);
			break;
		
		case 0x07:
			/* control register */
			/* mod is H */
			if (Data & 0x40)
			{
				/* select channel */
				chip->Cur_Chan = Data & 0x07;
			}
			/* mod is L */
			else
			{
				/* pcm ram bank select */
				chip->Bank = (Data & 0x0F) << 12;
			}
			
			/* sounding bit */
			if (Data & 0x80)
				chip->Enable = 0xFF;	// Used as mask
			else
				chip->Enable = 0;
			
			//LOG_MSG(pcm, LOG_MSG_LEVEL_DEBUG1,
			//	"General Enable = %.2X", Data);
			break;
		
		case 0x08:
			/* sound on/off register */
			Data = ~Data;
			
			//LOG_MSG(pcm, LOG_MSG_LEVEL_DEBUG1,
			//	"Channel Enable = %.2X", Data);
			
			for (i = 0; i < 8; i++)
			{
				chan = &chip->Channel[i];
				if (!chan->Enable)
					chan->Addr = chan->St_Addr << PCM_STEP_SHIFT;
			}
			
			for (i = 0; i < 8; i++)
			{
				chip->Channel[i].Enable = Data & (1 << i);
			}
	}
}